

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void * __thiscall google::protobuf::DescriptorPool::Tables::AllocateBytes(Tables *this,int size)

{
  int *piVar1;
  int *sizep;
  int *local_28;
  
  if (size == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)operator_new((long)size + 8);
    local_28 = piVar1;
    std::
    vector<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>,std::allocator<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>>>
    ::emplace_back<int*&>
              ((vector<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>,std::allocator<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>>>
                *)&this->misc_allocs_,&local_28);
    *local_28 = size;
    piVar1 = piVar1 + 2;
  }
  return piVar1;
}

Assistant:

void* DescriptorPool::Tables::AllocateBytes(int size) {
  if (size == 0) return nullptr;
  void* p = ::operator new(size + RoundUpTo<8>(sizeof(int)));
  int* sizep = static_cast<int*>(p);
  misc_allocs_.emplace_back(sizep);
  *sizep = size;
  return static_cast<char*>(p) + RoundUpTo<8>(sizeof(int));
}